

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O1

void __thiscall glslang::TVariable::dump(TVariable *this,TInfoSink *infoSink,bool complete)

{
  TInfoSinkBase *this_00;
  TString name;
  TString structName;
  int iVar1;
  undefined4 extraout_var;
  TPoolAllocator *pTVar2;
  TPoolAllocator *pTVar3;
  char *s;
  undefined7 in_register_00000011;
  char *__end;
  undefined1 *puVar4;
  undefined8 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff70 [16];
  undefined1 *puVar5;
  undefined8 in_stack_ffffffffffffff90;
  undefined1 local_68 [16];
  TString local_58;
  
  this_00 = &infoSink->debug;
  iVar1 = (*(this->super_TSymbol)._vptr_TSymbol[3])();
  TInfoSinkBase::append(this_00,*(char **)(CONCAT44(extraout_var,iVar1) + 8));
  TInfoSinkBase::append(this_00,": ");
  if ((int)CONCAT71(in_register_00000011,complete) == 0) {
    s = TType::getStorageQualifierString(&this->type);
    TInfoSinkBase::append(this_00,s);
    TInfoSinkBase::append(this_00," ");
    TType::getBasicTypeString_abi_cxx11_(&local_58,&this->type);
    TInfoSinkBase::append(this_00,&local_58);
    if ((this->type).arraySizes != (TArraySizes *)0x0) {
      TInfoSinkBase::append(this_00,"[0]");
    }
  }
  else {
    pTVar2 = GetThreadPoolAllocator();
    puVar4 = &stack0xffffffffffffff70;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               &stack0xffffffffffffff58,"","");
    pTVar3 = GetThreadPoolAllocator();
    puVar5 = local_68;
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    _M_construct<char_const*>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
               &stack0xffffffffffffff80,"","");
    name._M_dataplus._M_p = (pointer)&stack0xffffffffffffff80;
    name._M_dataplus.super_allocator_type.allocator = (TPoolAllocator *)&stack0xffffffffffffff58;
    name._M_string_length = (size_type)pTVar2;
    name.field_2._M_allocated_capacity = (size_type)puVar4;
    name.field_2._8_8_ = in_stack_ffffffffffffff68;
    structName._M_string_length = (size_type)pTVar3;
    structName._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)in_stack_ffffffffffffff70._0_8_;
    structName._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff70._8_8_;
    structName.field_2._M_allocated_capacity = (size_type)puVar5;
    structName.field_2._8_8_ = in_stack_ffffffffffffff90;
    TType::getCompleteString(&local_58,&this->type,false,true,true,true,name,structName);
    TInfoSinkBase::append(this_00,&local_58);
    TSymbol::dumpExtensions(&this->super_TSymbol,infoSink);
  }
  TInfoSinkBase::append(this_00,"\n");
  return;
}

Assistant:

void TVariable::dump(TInfoSink& infoSink, bool complete) const
{
    if (complete) {
        infoSink.debug << getName().c_str() << ": " << type.getCompleteString();
        dumpExtensions(infoSink);
    } else {
        infoSink.debug << getName().c_str() << ": " << type.getStorageQualifierString() << " "
                       << type.getBasicTypeString();

        if (type.isArray())
            infoSink.debug << "[0]";
    }

    infoSink.debug << "\n";
}